

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_iinq.c
# Opt level: O0

void iinq_test_create_query_select_all_from_where_single_dictionary(planck_unit_test_t *tc)

{
  _func_ion_cursor_status_t_ion_dict_cursor_t_ptr_ion_record_t_ptr *p_Var1;
  ion_dict_cursor_t *piVar2;
  ion_iinq_source_t *piVar3;
  ion_iinq_source_t *piVar4;
  ion_iinq_source_t *piVar5;
  void *pvVar6;
  _func_void_ion_dict_cursor_t_ptr_ptr *p_Var7;
  code *pcVar8;
  ion_iinq_query_processor_func_t p_Var9;
  ion_iinq_cleanup_t *piVar10;
  ion_err_t iVar11;
  planck_unit_result_t pVar12;
  ion_cursor_status_t iVar13;
  ion_value_t *ppvVar14;
  undefined1 *puVar15;
  int iVar16;
  void *pvVar17;
  undefined8 uStack_1b0;
  undefined1 auStack_1a8 [14];
  bool local_19a;
  bool local_199;
  ion_value_t *local_198;
  ion_iinq_cleanup_t *copyer;
  undefined1 local_188 [4];
  ion_iinq_result_size_t result_loc;
  ion_iinq_source_t test;
  ion_iinq_cleanup_t *last_cursor;
  ion_iinq_cleanup_t *ref_cursor;
  ion_iinq_cleanup_t *last;
  ion_iinq_cleanup_t *first;
  ion_iinq_result_t result;
  ion_err_t error_1;
  undefined4 local_78;
  undefined4 local_74;
  ion_status_t local_70;
  undefined4 local_68;
  undefined4 local_64;
  code *local_60;
  undefined8 local_58;
  undefined4 *local_50;
  ion_value_t value;
  ion_key_t key;
  undefined4 local_38;
  ion_value_size_t value_size;
  ion_key_size_t key_size;
  ion_key_type_t key_type;
  ion_iinq_query_processor_t processor;
  int32_t iStack_18;
  ion_status_t status;
  ion_err_t error;
  planck_unit_test_t *tc_local;
  
  puVar15 = auStack_1a8;
  local_60 = print_hello;
  local_58 = 0;
  _key_size = print_hello;
  processor.execute = (ion_iinq_query_processor_func_t)0x0;
  value_size = 0;
  local_38 = 4;
  key._4_4_ = 4;
  uStack_1b0 = 0x10190c;
  iVar11 = iinq_create_source("test.inq",key_type_numeric_signed,4,4);
  uStack_1b0 = 0x10192a;
  pVar12 = planck_unit_assert_int_are_equal
                     (tc,0,(int)iVar11,0xc0,
                      "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                     );
  if (pVar12 == '\0') {
    uStack_1b0 = 0x101944;
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  local_64 = 1;
  value = &local_64;
  local_68 = 1;
  local_50 = &local_68;
  uStack_1b0 = 0x101976;
  local_70 = iinq_insert("test.inq",value,local_50);
  processor.state._4_1_ = local_70.error;
  iVar16 = (int)processor.state._4_1_;
  uStack_1b0 = 0x10199d;
  unique0x10000868 = local_70;
  pVar12 = planck_unit_assert_int_are_equal
                     (tc,0,iVar16,0xc6,
                      "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                     );
  if (pVar12 == '\0') {
    uStack_1b0 = 0x1019b7;
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  uStack_1b0 = 0x1019d4;
  pVar12 = planck_unit_assert_int_are_equal
                     (tc,1,iStack_18,199,
                      "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                     );
  if (pVar12 == '\0') {
    uStack_1b0 = 0x1019ee;
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  local_74 = 1;
  value = &local_74;
  local_78 = 1;
  local_50 = &local_78;
  uStack_1b0 = 0x101a20;
  register0x00000000 = iinq_insert("test.inq",value,local_50);
  uStack_1b0 = 0x101a47;
  pVar12 = planck_unit_assert_int_are_equal
                     (tc,0,(int)processor.state._4_1_,0xcd,
                      "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                     );
  if (pVar12 == '\0') {
    uStack_1b0 = 0x101a61;
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  uStack_1b0 = 0x101a7e;
  pVar12 = planck_unit_assert_int_are_equal
                     (tc,1,iStack_18,0xce,
                      "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/iinq/test_iinq.c"
                     );
  if (pVar12 == '\0') {
    uStack_1b0 = 0x101a98;
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  first._0_4_ = 0;
  test.cleanup.last = (iinq_cleanup *)0x0;
  test.cleanup.next = (iinq_cleanup *)0x0;
  test.ion_record.value = local_188;
  last = (ion_iinq_cleanup_t *)&test.ion_record.value;
  ppvVar14 = &test.ion_record.value;
  test.cleanup.reference = (ion_iinq_source_t *)0x0;
  test.dictionary.instance = (ion_dictionary_parent_t *)local_188;
  uStack_1b0 = 0x101b85;
  result.data._7_1_ =
       iinq_open_source("test.inq",(ion_dictionary_t *)&test.handler.close_dictionary,
                        (ion_dictionary_handler_t *)local_188);
  if (result.data._7_1_ == '\0') {
    test._144_8_ = auStack_1a8 +
                   -((long)*(int *)(test.dictionary._0_8_ + 4) + 0xfU & 0xfffffffffffffff0);
    puVar15 = (undefined1 *)
              (test._144_8_ +
              -((long)*(int *)(test.dictionary._0_8_ + 8) + 0xfU & 0xfffffffffffffff0));
    first._0_4_ = *(int *)(test.dictionary._0_8_ + 8) +
                  *(int *)(test.dictionary._0_8_ + 4) + (uint)first;
    test.key = puVar15;
    test.value = (ion_value_t)test._144_8_;
    test.ion_record.key = puVar15;
    *(undefined8 *)(puVar15 + -8) = 0x101c3c;
    result.data._7_1_ =
         dictionary_build_predicate((ion_predicate_t *)&test.dictionary.handler,'\x02');
    if (result.data._7_1_ == '\0') {
      *(undefined8 *)(puVar15 + -8) = 0x101c68;
      dictionary_find((ion_dictionary_t *)&test.handler.close_dictionary,
                      (ion_predicate_t *)&test.dictionary.handler,
                      (ion_dict_cursor_t **)&test.predicate.destroy);
      puVar15 = puVar15 + -((ulong)(uint)first + 0xf & 0xfffffffffffffff0);
      result._0_8_ = puVar15;
      for (last_cursor = last;
          (piVar10 = (ion_iinq_cleanup_t *)ppvVar14, last_cursor != (ion_iinq_cleanup_t *)ppvVar14
          && (last_cursor != (ion_iinq_cleanup_t *)0x0)); last_cursor = last_cursor->next) {
        p_Var1 = last_cursor->reference->cursor->next;
        piVar2 = last_cursor->reference->cursor;
        piVar3 = last_cursor->reference;
        *(undefined8 *)(puVar15 + -8) = 0x101cee;
        iVar13 = (*p_Var1)(piVar2,&piVar3->ion_record);
        last_cursor->reference->cursor_status = iVar13;
        if ((iVar13 != '\x04') && (last_cursor->reference->cursor_status != '\x02')) break;
      }
LAB_00101d4b:
      last_cursor = piVar10;
      if (last_cursor != (ion_iinq_cleanup_t *)0x0) {
        test.cleanup.last = last_cursor;
        while( true ) {
          local_199 = false;
          if (last_cursor != (ion_iinq_cleanup_t *)0x0) {
            p_Var1 = last_cursor->reference->cursor->next;
            piVar2 = last_cursor->reference->cursor;
            piVar3 = last_cursor->reference;
            *(undefined8 *)(puVar15 + -8) = 0x101db9;
            iVar13 = (*p_Var1)(piVar2,&piVar3->ion_record);
            last_cursor->reference->cursor_status = iVar13;
            local_19a = false;
            if (iVar13 != '\x04') {
              local_19a = last_cursor->reference->cursor_status != '\x02';
            }
            local_199 = local_19a;
          }
          if (local_199 == false) break;
          p_Var7 = last_cursor->reference->cursor->destroy;
          piVar3 = last_cursor->reference;
          *(undefined8 *)(puVar15 + -8) = 0x101e41;
          (*p_Var7)(&piVar3->cursor);
          piVar3 = last_cursor->reference;
          piVar4 = last_cursor->reference;
          piVar5 = last_cursor->reference;
          *(undefined8 *)(puVar15 + -8) = 0x101e73;
          dictionary_find(&piVar3->dictionary,&piVar4->predicate,&piVar5->cursor);
          p_Var1 = last_cursor->reference->cursor->next;
          piVar2 = last_cursor->reference->cursor;
          piVar3 = last_cursor->reference;
          *(undefined8 *)(puVar15 + -8) = 0x101eac;
          iVar13 = (*p_Var1)(piVar2,&piVar3->ion_record);
          last_cursor->reference->cursor_status = iVar13;
          if ((iVar13 != '\x04') && (last_cursor->reference->cursor_status != '\x02'))
          goto LAB_00102041;
          last_cursor = last_cursor->last;
        }
        if (last_cursor == (ion_iinq_cleanup_t *)0x0) goto LAB_00102041;
        if (test.cleanup.last != last_cursor) {
          last_cursor = (ion_iinq_cleanup_t *)ppvVar14;
        }
        piVar10 = last_cursor;
        if (*(int *)test._144_8_ == 1) {
          copyer._4_4_ = 0;
          for (local_198 = (ion_value_t *)last; p_Var9 = processor.execute, pcVar8 = _key_size,
              local_198 != (ion_value_t *)0x0; local_198 = (ion_value_t *)local_198[1]) {
            pvVar17 = (void *)(result._0_8_ + (ulong)copyer._4_4_);
            pvVar6 = *(void **)((long)*local_198 + 0x98);
            iVar16 = *(int *)(*(long *)((long)*local_198 + 0x58) + 4);
            *(undefined8 *)(puVar15 + -8) = 0x101f9e;
            memcpy(pvVar17,pvVar6,(long)iVar16);
            copyer._4_4_ = *(int *)(*(long *)((long)*local_198 + 0x58) + 4) + copyer._4_4_;
            pvVar17 = (void *)(result._0_8_ + (ulong)copyer._4_4_);
            pvVar6 = *(void **)((long)*local_198 + 0xa0);
            iVar16 = *(int *)(*(long *)((long)*local_198 + 0x58) + 8);
            *(undefined8 *)(puVar15 + -8) = 0x101ff3;
            memcpy(pvVar17,pvVar6,(long)iVar16);
            copyer._4_4_ = *(int *)(*(long *)((long)*local_198 + 0x58) + 8) + copyer._4_4_;
          }
          *(undefined8 *)(puVar15 + -8) = 0x102038;
          (*pcVar8)(&first,p_Var9);
        }
        goto LAB_00101d4b;
      }
LAB_00102041:
      for (; last != (ion_iinq_cleanup_t *)0x0; last = last->next) {
        p_Var7 = last->reference->cursor->destroy;
        piVar3 = last->reference;
        *(undefined8 *)(puVar15 + -8) = 0x102074;
        (*p_Var7)(&piVar3->cursor);
        piVar3 = last->reference;
        *(undefined8 *)(puVar15 + -8) = 0x102087;
        ion_close_dictionary(&piVar3->dictionary);
      }
    }
  }
  *(undefined8 *)(puVar15 + -8) = 0x1020a9;
  iinq_drop("test.inq");
  return;
}

Assistant:

void
iinq_test_create_query_select_all_from_where_single_dictionary(
	planck_unit_test_t *tc
) {
	ion_err_t					error;
	ion_status_t				status;
	ion_iinq_query_processor_t	processor;

	ion_key_type_t		key_type;
	ion_key_size_t		key_size;
	ion_value_size_t	value_size;
	ion_key_t			key;
	ion_value_t			value;

	processor	= IINQ_QUERY_PROCESSOR(print_hello, NULL);

	key_type	= key_type_numeric_signed;
	key_size	= sizeof(int);
	value_size	= sizeof(int);

	error		= CREATE_DICTIONARY(test, key_type, key_size, value_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, error);

	key			= IONIZE(1, int);
	value		= IONIZE(1, int);

	status		= INSERT(test, key, value);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 1, status.count);

	key		= IONIZE(1, int);
	value	= IONIZE(1, int);

	status	= INSERT(test, key, value);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 1, status.count);

	QUERY(SELECT_ALL, FROM(test), WHERE(NEUTRALIZE(test.key, int) == 1), , , , , , &processor);

	DROP(test);
}